

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O1

int ply_write_chunk(p_ply ply,void *anybuffer,size_t size)

{
  size_t sVar1;
  ulong uVar2;
  
  if (((ply != (p_ply)0x0) && (ply->fp != (FILE *)0x0)) && (ply->io_mode == PLY_WRITE)) {
    if (0x2000 < ply->buffer_last) {
      __assert_fail("ply->buffer_last <= BUFFERSIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                    ,0x432,"int ply_write_chunk(p_ply, void *, size_t)");
    }
    if (size != 0) {
      uVar2 = 0;
      do {
        if (ply->buffer_last < 0x2000) {
          ply->buffer[ply->buffer_last] = *(char *)((long)anybuffer + uVar2);
          ply->buffer_last = ply->buffer_last + 1;
          uVar2 = uVar2 + 1;
        }
        else {
          ply->buffer_last = 0;
          sVar1 = fwrite(ply->buffer,1,0x2000,(FILE *)ply->fp);
          if (sVar1 < 0x2000) {
            return 0;
          }
        }
      } while (uVar2 < size);
    }
    return 1;
  }
  __assert_fail("ply && ply->fp && ply->io_mode == PLY_WRITE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                ,0x431,"int ply_write_chunk(p_ply, void *, size_t)");
}

Assistant:

static int ply_write_chunk(p_ply ply, void *anybuffer, size_t size) {
    char *buffer = (char *) anybuffer;
    size_t i = 0;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(ply->buffer_last <= BUFFERSIZE);
    while (i < size) {
        if (ply->buffer_last < BUFFERSIZE) {
            ply->buffer[ply->buffer_last] = buffer[i];
            ply->buffer_last++;
            i++;
        } else {
            ply->buffer_last = 0;
            if (fwrite(ply->buffer, 1, BUFFERSIZE, ply->fp) < BUFFERSIZE)
                return 0;
        }
    }
    return 1;
}